

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

size_t rtosc_bundle_elements(char *buffer,size_t len)

{
  uint32_t uVar1;
  ulong in_RSI;
  long in_RDI;
  bool bVar2;
  size_t elms;
  uint32_t *lengths;
  size_t local_20;
  uint8_t *local_18;
  
  local_18 = (uint8_t *)(in_RDI + 0x10);
  local_20 = 0;
  while( true ) {
    bVar2 = false;
    if ((ulong)((long)local_18 - in_RDI) < in_RSI) {
      uVar1 = extract_uint32(local_18);
      bVar2 = uVar1 != 0;
    }
    if (!bVar2) break;
    uVar1 = extract_uint32(local_18);
    local_18 = local_18 + (ulong)((uVar1 >> 2) + 1) * 4;
    if (in_RSI < (ulong)((long)local_18 - in_RDI)) {
      return local_20;
    }
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

size_t rtosc_bundle_elements(const char *buffer, size_t len)
{
    const uint32_t *lengths = (const uint32_t*) (buffer+16);
    size_t elms = 0;
    while(POS < len && extract_uint32((const uint8_t*)lengths)) {
        lengths += extract_uint32((const uint8_t*)lengths)/4+1;

        if(POS > len)
            break;
        ++elms;
    }
    return elms;
}